

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,int *size)

{
  byte bVar1;
  int iVar2;
  long in_RDI;
  int *in_R8;
  bool ret;
  vec<Minisat::Lit> *in_stack_00000038;
  Var in_stack_00000044;
  Clause *in_stack_00000048;
  Clause *in_stack_00000050;
  SimpSolver *in_stack_00000058;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  *(int *)(in_RDI + 0x1420) = *(int *)(in_RDI + 0x1420) + 1;
  vec<Minisat::Lit>::clear
            ((vec<Minisat::Lit> *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
             SUB81((ulong)in_RDI >> 0x38,0));
  bVar1 = merge(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000044,
                in_stack_00000038);
  iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x1510));
  *in_R8 = iVar2;
  return (bool)(bVar1 & 1);
}

Assistant:

bool SimpSolver::merge(const Clause &_ps, const Clause &_qs, Var v, int &size)
{
    merges++;
    merge_count_cls.clear();
    bool ret = merge(_ps, _qs, v, merge_count_cls);
    size = merge_count_cls.size();
    return ret;
}